

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O2

void amrex::printCell<amrex::FArrayBox,void>
               (FabArray<amrex::FArrayBox> *mf,IntVect *cell,int comp,IntVect *ng)

{
  ostringstream *os;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  FArrayBox *pFVar9;
  double *pdVar10;
  bool bVar11;
  ostream *poVar12;
  int *piVar13;
  Long LVar14;
  Print *pPVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  Box result;
  MFIter mfi;
  ostringstream ss;
  undefined1 local_3d8 [72];
  int local_390 [2];
  int local_388;
  long *local_370;
  string local_350 [32];
  Print local_330;
  long local_1a8;
  undefined8 local_1a0 [46];
  
  MFIter::MFIter((MFIter *)(local_3d8 + 0x28),&mf->super_FabArrayBase,'\0');
  while (local_390[0] < local_388) {
    MFIter::validbox((Box *)&local_330,(MFIter *)(local_3d8 + 0x28));
    local_3d8._0_4_ = local_330.rank;
    local_3d8._4_4_ = local_330.comm;
    Box::grow((Box *)local_3d8,ng);
    bVar11 = Box::contains((Box *)local_3d8,cell);
    if (bVar11) {
      if (comp < 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 0x11;
        uVar16 = (long)(mf->super_FabArrayBase).n_comp - 1;
        uVar18 = 0;
        if (0 < (int)uVar16) {
          uVar18 = uVar16 & 0xffffffff;
        }
        uVar17 = 0;
        while( true ) {
          piVar13 = local_390;
          if (uVar18 == uVar17) break;
          if (local_370 != (long *)0x0) {
            piVar13 = (int *)((long)local_390[0] * 4 + *local_370);
          }
          pFVar9 = (mf->m_fabs_v).
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar13];
          iVar1 = cell->vect[0];
          iVar2 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
          iVar3 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain.smallend + 4);
          iVar4 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[0];
          iVar5 = cell->vect[1];
          iVar6 = cell->vect[2];
          iVar7 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain.smallend + 8);
          iVar8 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain.bigend + 4);
          pdVar10 = (pFVar9->super_BaseFab<double>).dptr;
          LVar14 = Box::numPts(&(pFVar9->super_BaseFab<double>).domain);
          poVar12 = std::ostream::_M_insert<double>
                              (pdVar10[((long)iVar1 - (long)iVar2) +
                                       (long)((((iVar8 - iVar3) + 1) * (iVar6 - iVar7) +
                                              (iVar5 - iVar3)) * ((iVar4 - iVar2) + 1)) +
                                       LVar14 * uVar17]);
          std::operator<<(poVar12,", ");
          uVar17 = uVar17 + 1;
        }
        if (local_370 != (long *)0x0) {
          piVar13 = (int *)((long)local_390[0] * 4 + *local_370);
        }
        pFVar9 = (mf->m_fabs_v).
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[*piVar13];
        iVar1 = cell->vect[0];
        iVar2 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
        iVar3 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain.smallend + 4);
        iVar4 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[0];
        iVar5 = cell->vect[1];
        iVar6 = cell->vect[2];
        iVar7 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain.smallend + 8);
        iVar8 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain.bigend + 4);
        pdVar10 = (pFVar9->super_BaseFab<double>).dptr;
        LVar14 = Box::numPts(&(pFVar9->super_BaseFab<double>).domain);
        std::ostream::_M_insert<double>
                  (pdVar10[((long)iVar1 - (long)iVar2) +
                           (long)((((iVar8 - iVar3) + 1) * (iVar6 - iVar7) + (iVar5 - iVar3)) *
                                 ((iVar4 - iVar2) + 1)) + LVar14 * uVar16]);
        poVar12 = OutStream();
        os = &local_330.ss;
        AllPrint::AllPrint((AllPrint *)&local_330,poVar12);
        std::operator<<((ostream *)os," At cell ");
        operator<<((ostream *)os,cell);
        std::operator<<((ostream *)os," in Box ");
        operator<<((ostream *)os,(Box *)local_3d8);
        std::operator<<((ostream *)os,": ");
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)os,local_350);
        std::endl<char,std::char_traits<char>>((ostream *)os);
        std::__cxx11::string::~string(local_350);
        Print::~Print(&local_330);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      }
      else {
        poVar12 = OutStream();
        AllPrint::AllPrint((AllPrint *)&local_330,poVar12);
        *(undefined8 *)
         (&local_330.field_0x18 + *(long *)(CONCAT44(local_330._20_4_,local_330._16_4_) + -0x18)) =
             0x11;
        std::operator<<((ostream *)&local_330.ss," At cell ");
        operator<<((ostream *)&local_330.ss,cell);
        std::operator<<((ostream *)&local_330.ss," in Box ");
        operator<<((ostream *)&local_330.ss,(Box *)local_3d8);
        std::operator<<((ostream *)&local_330.ss,": ");
        piVar13 = local_390;
        if (local_370 != (long *)0x0) {
          piVar13 = (int *)((long)local_390[0] * 4 + *local_370);
        }
        pFVar9 = (mf->m_fabs_v).
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[*piVar13];
        iVar1 = cell->vect[0];
        iVar2 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
        iVar3 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain.smallend + 4);
        iVar4 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[0];
        iVar5 = cell->vect[1];
        iVar6 = cell->vect[2];
        iVar7 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain.smallend + 8);
        iVar8 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain.bigend + 4);
        pdVar10 = (pFVar9->super_BaseFab<double>).dptr;
        LVar14 = Box::numPts(&(pFVar9->super_BaseFab<double>).domain);
        pPVar15 = Print::operator<<(&local_330,
                                    pdVar10 + ((long)iVar1 - (long)iVar2) +
                                              (long)((((iVar8 - iVar3) + 1) * (iVar6 - iVar7) +
                                                     (iVar5 - iVar3)) * ((iVar4 - iVar2) + 1)) +
                                              LVar14 * (ulong)(uint)comp);
        std::endl<char,std::char_traits<char>>((ostream *)&pPVar15->ss);
        Print::~Print(&local_330);
      }
    }
    MFIter::operator++((MFIter *)(local_3d8 + 0x28));
  }
  MFIter::~MFIter((MFIter *)(local_3d8 + 0x28));
  return;
}

Assistant:

void
printCell (FabArray<FAB> const& mf, const IntVect& cell, int comp = -1,
           const IntVect& ng = IntVect::TheZeroVector())
{
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        const Box& bx = amrex::grow(mfi.validbox(), ng);
        if (bx.contains(cell)) {
            if (comp >= 0) {
                amrex::AllPrint().SetPrecision(17) << " At cell " << cell << " in Box " << bx
                                                   << ": " << mf[mfi](cell, comp) << std::endl;
            } else {
                std::ostringstream ss;
                ss.precision(17);
                const int ncomp = mf.nComp();
                for (int i = 0; i < ncomp-1; ++i)
                {
                    ss << mf[mfi](cell,i) << ", ";
                }
                ss << mf[mfi](cell,ncomp-1);
                amrex::AllPrint() << " At cell " << cell << " in Box " << bx
                                  << ": " << ss.str() << std::endl;
            }
        }
    }
}